

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

PathTypeHandlerBase * __thiscall
Js::PathTypeHandlerBase::BuildPathTypeFromNewRoot
          (PathTypeHandlerBase *this,DynamicObject *instance,DynamicType **typeRef)

{
  byte bVar1;
  DynamicType *this_00;
  code *pcVar2;
  bool bVar3;
  ObjectSlotAttributes attributes;
  ushort uVar4;
  PropertyIndex PVar5;
  int iVar6;
  int iVar7;
  undefined4 *puVar8;
  PathTypeHandlerBase *this_01;
  undefined4 extraout_var;
  ushort uVar10;
  PathTypeSuccessorKey local_68;
  DynamicObject *local_60;
  undefined4 *local_58;
  DynamicType **local_50;
  ScriptContext *local_48;
  DynamicType *local_40;
  PropertyIndex local_32;
  long lVar9;
  
  local_60 = instance;
  if (typeRef == (DynamicType **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xa94,"(typeRef)","typeRef");
    if (!bVar3) goto LAB_00dc256e;
    *puVar8 = 0;
  }
  this_00 = *typeRef;
  local_50 = typeRef;
  local_48 = Js::Type::GetScriptContext(&this_00->super_Type);
  bVar1 = (this->super_DynamicTypeHandler).flags;
  this_01 = &PathTypeHandlerNoAttr::New
                       (local_48,(((local_48->super_ScriptContextBase).javascriptLibrary)->rootPath)
                                 .ptr,0,(PropertyIndex)(this->super_DynamicTypeHandler).slotCapacity
                        ,(this->super_DynamicTypeHandler).inlineSlotCapacity,
                        (this->super_DynamicTypeHandler).offsetOfInlineSlots,
                        SUB81(((ulong)bVar1 & 0xffffff04) >> 2,0),(bool)((bVar1 & 0x10) >> 4),
                        (DynamicType *)0x0)->super_PathTypeHandlerBase;
  DynamicTypeHandler::SetFlags
            (&this_01->super_DynamicTypeHandler,(this->super_DynamicTypeHandler).flags & 8);
  Memory::Recycler::WBSetBit((char *)&this_00->typeHandler);
  (this_00->typeHandler).ptr = &this_01->super_DynamicTypeHandler;
  local_40 = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_00->typeHandler);
  iVar6 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
  lVar9 = CONCAT44(extraout_var,iVar6);
  local_32 = 0;
  uVar10 = (this->super_DynamicTypeHandler).unusedBytes;
  if (uVar10 < 2) {
    uVar10 = uVar10 >> 1;
  }
  else {
    local_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar4 = 0;
    do {
      iVar6 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[8])
                        (this,local_48,(ulong)uVar4);
      if (lVar9 == 0) {
        attributes = ObjectSlotAttr_Default;
      }
      else {
        attributes = *(ObjectSlotAttributes *)(lVar9 + (ulong)local_32);
      }
      PathTypeSuccessorKey::PathTypeSuccessorKey(&local_68,iVar6,attributes);
      local_40 = PromoteType<false>(this_01,local_40,local_68,true,local_48,local_60,&local_32);
      this_01 = FromTypeHandler((local_40->typeHandler).ptr);
      puVar8 = local_58;
      if (attributes == ObjectSlotAttr_Setter) {
        PVar5 = TypePath::LookupInline
                          ((this_01->typePath).ptr,iVar6,
                           (uint)((this_01->super_DynamicTypeHandler).unusedBytes >> 1));
        if (PVar5 == 0xffff) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0xaa7,"(getterIndex != Constants::NoSlot)",
                                      "getterIndex != Constants::NoSlot");
          if (!bVar3) goto LAB_00dc256e;
          *puVar8 = 0;
        }
        if ((*(byte *)(lVar9 + (ulong)PVar5) & 0x10) != 0) {
          (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x73])
                    (this_01,(ulong)PVar5,
                     (ulong)(byte)((char)((this_01->super_DynamicTypeHandler).unusedBytes >> 1) - 1)
                    );
        }
      }
      uVar4 = local_32 + 1;
      uVar10 = (this->super_DynamicTypeHandler).unusedBytes >> 1;
      local_32 = uVar4;
    } while (uVar4 < uVar10);
  }
  if ((this_01->super_DynamicTypeHandler).unusedBytes >> 1 != uVar10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xaae,"(newTypeHandler->GetPathLength() == GetPathLength())",
                                "newTypeHandler->GetPathLength() == GetPathLength()");
    if (!bVar3) goto LAB_00dc256e;
    *puVar8 = 0;
  }
  iVar6 = (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[6])(this_01);
  iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[6])(this);
  if (iVar6 != iVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xaaf,"(newTypeHandler->GetPropertyCount() == GetPropertyCount())",
                                "newTypeHandler->GetPropertyCount() == GetPropertyCount()");
    if (!bVar3) goto LAB_00dc256e;
    *puVar8 = 0;
  }
  iVar6 = (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])(this_01);
  iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])(this);
  if ((char)iVar6 != (char)iVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xab0,"(newTypeHandler->GetSetterCount() == GetSetterCount())",
                                "newTypeHandler->GetSetterCount() == GetSetterCount()");
    if (!bVar3) {
LAB_00dc256e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  *local_50 = local_40;
  return this_01;
}

Assistant:

PathTypeHandlerBase *
    PathTypeHandlerBase::BuildPathTypeFromNewRoot(DynamicObject * instance, DynamicType ** typeRef)
    {
        Assert(typeRef);
        DynamicType * type = *typeRef;
        ScriptContext * scriptContext = type->GetScriptContext();

        PathTypeHandlerBase* newTypeHandler = PathTypeHandlerNoAttr::New(scriptContext, scriptContext->GetLibrary()->GetRootPath(), 0, static_cast<PropertyIndex>(this->GetSlotCapacity()), this->GetInlineSlotCapacity(), this->GetOffsetOfInlineSlots(), GetIsLocked(), GetIsShared());
        newTypeHandler->SetFlags(MayBecomeSharedFlag, GetFlags());
        type->typeHandler = newTypeHandler;

        // Promote type based on existing properties to get new type which will be cached and shared
        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        for (PropertyIndex propertyIndex = 0; propertyIndex < GetPathLength(); propertyIndex++)
        {
            Js::PropertyId propertyId = GetPropertyId(scriptContext, propertyIndex);
            ObjectSlotAttributes attr = attributes ? attributes[propertyIndex] : ObjectSlotAttr_Default;
            type = newTypeHandler->PromoteType<false>(type, PathTypeSuccessorKey(propertyId, attr), true, scriptContext, instance, &propertyIndex);
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler());
            if (attr == ObjectSlotAttr_Setter)
            {
                PropertyIndex getterIndex = newTypeHandler->GetTypePath()->LookupInline(propertyId, newTypeHandler->GetPathLength());
                Assert(getterIndex != Constants::NoSlot);
                if (attributes[getterIndex] & ObjectSlotAttr_Accessor)
                {
                    newTypeHandler->SetSetterSlot(getterIndex, (PathTypeSetterSlotIndex)(newTypeHandler->GetPathLength() - 1));
                }
            }
        }
        Assert(newTypeHandler->GetPathLength() == GetPathLength());
        Assert(newTypeHandler->GetPropertyCount() == GetPropertyCount());
        Assert(newTypeHandler->GetSetterCount() == GetSetterCount());

        *typeRef = type;

        return newTypeHandler;
    }